

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  pointer pcVar5;
  Options OVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  OptionAdder *pOVar10;
  size_t sVar11;
  ostream *poVar12;
  OptionValue *pOVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  SentencePieceLearner *this;
  bool *pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  long lVar17;
  char **argv_00;
  void *pvVar18;
  int *piVar19;
  ulong uVar20;
  char *pcVar21;
  pointer pbVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subword_args;
  string outputFileName;
  ParseResult subvm;
  Tokenizer tokenizer;
  ParseResult vm;
  ofstream outputFile;
  Options cmd_options;
  _Alloc_hider _Var26;
  pointer in_stack_fffffffffffff3f0;
  undefined8 in_stack_fffffffffffff3f8;
  undefined8 in_stack_fffffffffffff400;
  _Alloc_hider _Var27;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff410;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var28;
  undefined8 in_stack_fffffffffffff418;
  undefined1 in_stack_fffffffffffff420 [16];
  undefined4 in_stack_fffffffffffff434;
  _Alloc_hider _Var29;
  undefined8 in_stack_fffffffffffff448;
  undefined8 in_stack_fffffffffffff450;
  _Alloc_hider _Var30;
  undefined8 in_stack_fffffffffffff468;
  undefined8 in_stack_fffffffffffff470;
  _Alloc_hider _Var31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff480;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 in_stack_fffffffffffff488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b68;
  undefined1 local_b48 [32];
  undefined1 local_b28 [16];
  undefined1 local_b18 [24];
  bool local_b00;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_af8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_ac0;
  string local_a88;
  string local_a68;
  element_type *local_a48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a40;
  undefined1 local_a38 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_a28;
  pointer local_a20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_a18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a08;
  pointer local_a00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9f8;
  undefined1 local_9e8 [32];
  string local_9c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9a8;
  pointer local_9a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_998;
  undefined1 local_988 [20];
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_950;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_918;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_900;
  shared_ptr<const_cxxopts::Value> local_8e8;
  undefined1 local_8d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c8;
  element_type local_8b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_8a0;
  element_type *local_898;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_890;
  element_type *local_888;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_880;
  element_type *local_878;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_870;
  element_type *local_868;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_860;
  string local_858;
  string local_838;
  string local_818;
  shared_ptr<const_cxxopts::Value> local_7f8;
  shared_ptr<const_cxxopts::Value> local_7e8;
  shared_ptr<const_cxxopts::Value> local_7d8;
  shared_ptr<const_cxxopts::Value> local_7c8;
  shared_ptr<const_cxxopts::Value> local_7b8;
  char **local_7a0;
  long *local_798;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_790;
  long *local_788;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_780;
  long *local_778;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_770;
  long *local_768;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_760;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  long local_598 [3];
  long *local_580;
  long local_570 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_558;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_540;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_500;
  undefined1 local_4f8 [56];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_4c0;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_488;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_470;
  undefined1 local_458 [8];
  _Alloc_hider _Stack_450;
  undefined1 local_448 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3d8;
  size_t sStack_3c8;
  element_type *local_3c0 [2];
  char local_3b0 [80];
  ios_base local_360 [272];
  Options local_250;
  undefined1 local_1a8 [376];
  
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"subword_learn","");
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f8,
             "Subword learning script.\n\nsubword_learn [TOKENIZATION_OPTIONS...] -- [SUBWORD_TYPE] [SUBWORD_OPTIONS...] < input_file > output_file\n"
             ,"");
  cxxopts::Options::Options((Options *)local_1a8,&local_5d8,&local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  local_9a8 = &local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"");
  uVar7 = local_998._M_allocated_capacity._0_4_;
  local_448._0_8_ = local_9a0;
  paVar1 = &local_5b8.field_2;
  if (local_9a8 == &local_998) {
    local_5b8.field_2._8_4_ = local_998._8_4_;
    local_5b8.field_2._12_4_ = local_998._12_4_;
    local_5b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_5b8._M_dataplus._M_p = (pointer)local_9a8;
  }
  local_5b8.field_2._M_allocated_capacity._4_4_ = local_998._M_allocated_capacity._4_4_;
  local_5b8.field_2._M_allocated_capacity._0_4_ = local_998._M_allocated_capacity._0_4_;
  local_5b8._M_string_length = (size_type)local_9a0;
  local_9a0 = (pointer)0x0;
  local_998._M_allocated_capacity._0_4_ = local_998._M_allocated_capacity._0_4_ & 0xffffff00;
  _Stack_450._M_p = local_448 + 8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p == paVar1) {
    local_448._8_8_ = CONCAT44(local_998._M_allocated_capacity._4_4_,uVar7);
    aStack_438._4_4_ = local_5b8.field_2._12_4_;
    aStack_438._0_4_ = local_5b8.field_2._8_4_;
  }
  else {
    _Stack_450._M_p = local_5b8._M_dataplus._M_p;
    local_448._8_8_ = local_5b8.field_2._M_allocated_capacity;
  }
  local_9a8 = &local_998;
  local_7a0 = argv;
  local_5b8._M_dataplus._M_p = (pointer)paVar1;
  local_458 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"h,help","");
  local_b28._0_8_ = (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"Show this help","");
  cxxopts::value<bool>();
  p_Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"");
  pOVar10 = cxxopts::OptionAdder::operator()
                      ((OptionAdder *)local_458,&local_5b8,(string *)local_b28,
                       (shared_ptr<const_cxxopts::Value> *)&stack0xfffffffffffff458,&local_618);
  local_4f8._0_8_ = local_4f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"v,verbose","");
  local_988._0_8_ = local_988 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"Enable verbose output","");
  cxxopts::value<bool>();
  _Var26._M_p = &stack0xfffffffffffff3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff3e8,"false","");
  (**(code **)(*(long *)local_b48._0_8_ + 0x50))
            (&stack0xfffffffffffff478,local_b48._0_8_,&stack0xfffffffffffff3e8);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"");
  cxxopts::OptionAdder::operator()
            (pOVar10,(string *)local_4f8,(string *)local_988,
             (shared_ptr<const_cxxopts::Value> *)&stack0xfffffffffffff438,&local_638);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if (in_stack_fffffffffffff480._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffff480._M_pi);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Var26._M_p != &stack0xfffffffffffff3f8) {
    operator_delete(_Var26._M_p,in_stack_fffffffffffff3f8 + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_);
  }
  if ((undefined1 *)local_988._0_8_ != local_988 + 0x10) {
    operator_delete((void *)local_988._0_8_,stack0xfffffffffffff688 + 1);
  }
  if ((undefined1 *)local_4f8._0_8_ != local_4f8 + 0x10) {
    operator_delete((void *)local_4f8._0_8_,local_4f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if (in_stack_fffffffffffff410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffff410._M_pi);
  }
  if (p_Var28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var28);
  }
  if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b28._0_8_ !=
      (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18) {
    operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_450._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_448 + 8)) {
    operator_delete(_Stack_450._M_p,local_448._8_8_ + 1);
  }
  if (local_9a8 != &local_998) {
    operator_delete(local_9a8,
                    CONCAT44(local_998._M_allocated_capacity._4_4_,
                             local_998._M_allocated_capacity._0_4_) + 1);
  }
  add_tokenization_options((Options *)local_1a8);
  local_a08 = &local_9f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a08,"Subword learning","");
  uVar7 = local_9f8._M_allocated_capacity._0_4_;
  local_448._0_8_ = local_a00;
  if (local_a08 == &local_9f8) {
    local_5b8.field_2._8_4_ = local_9f8._8_4_;
    local_5b8.field_2._12_4_ = local_9f8._12_4_;
    local_5b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_5b8._M_dataplus._M_p = (pointer)local_a08;
  }
  local_5b8.field_2._M_allocated_capacity._4_4_ = local_9f8._M_allocated_capacity._4_4_;
  local_5b8.field_2._M_allocated_capacity._0_4_ = local_9f8._M_allocated_capacity._0_4_;
  local_5b8._M_string_length = (size_type)local_a00;
  local_a00 = (pointer)0x0;
  local_9f8._M_allocated_capacity._0_4_ = local_9f8._M_allocated_capacity._0_4_ & 0xffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p == paVar1) {
    local_448._8_8_ = CONCAT44(local_9f8._M_allocated_capacity._4_4_,uVar7);
    aStack_438._4_4_ = local_5b8.field_2._12_4_;
    aStack_438._0_4_ = local_5b8.field_2._8_4_;
    _Stack_450._M_p = (pointer)(local_448 + 8);
  }
  else {
    _Stack_450._M_p = local_5b8._M_dataplus._M_p;
    local_448._8_8_ = local_5b8.field_2._M_allocated_capacity;
  }
  local_a08 = &local_9f8;
  local_5b8._M_dataplus._M_p = (pointer)paVar1;
  local_458 = (undefined1  [8])local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"i,input","");
  local_b28._0_8_ = (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b28,"Input files (if not set, the standard input is used)","");
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_b48._0_8_ = local_a48;
  local_b48._8_8_ = p_Stack_a40;
  local_a48 = (element_type *)0x0;
  p_Stack_a40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"");
  pOVar10 = cxxopts::OptionAdder::operator()
                      ((OptionAdder *)local_458,&local_5b8,(string *)local_b28,
                       (shared_ptr<const_cxxopts::Value> *)local_b48,&local_658);
  local_4f8._0_8_ = local_4f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"o,output","");
  local_988._0_8_ = local_988 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_988,"Output file (if not set, the standard output is used)","");
  cxxopts::value<std::__cxx11::string>();
  local_9e8._0_8_ = local_a68._M_dataplus._M_p;
  local_9e8._8_8_ = local_a68._M_string_length;
  local_a68._M_dataplus._M_p = (pointer)0x0;
  local_a68._M_string_length = 0;
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"");
  pOVar10 = cxxopts::OptionAdder::operator()
                      (pOVar10,(string *)local_4f8,(string *)local_988,
                       (shared_ptr<const_cxxopts::Value> *)local_9e8,&local_678);
  _Var26._M_p = &stack0xfffffffffffff3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff3e8,"tmpfile","");
  _Var30._M_p = &stack0xfffffffffffff468;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff458,"Temporary file for file-based learner","");
  cxxopts::value<std::__cxx11::string>();
  _Var29._M_p = local_9c8._M_dataplus._M_p;
  _Var27._M_p = &stack0xfffffffffffff418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff408,"input.tmp","")
  ;
  (**(code **)(*(size_type *)_Var29._M_p + 0x50))(&local_a88,_Var29._M_p,&stack0xfffffffffffff408);
  local_8c8._M_allocated_capacity = (size_type)local_a88._M_dataplus._M_p;
  local_8c8._8_8_ = local_a88._M_string_length;
  local_a88._M_dataplus._M_p = (pointer)0x0;
  local_a88._M_string_length = 0;
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"");
  pOVar10 = cxxopts::OptionAdder::operator()
                      (pOVar10,(string *)&stack0xfffffffffffff3e8,(string *)&stack0xfffffffffffff458
                       ,(shared_ptr<const_cxxopts::Value> *)(local_8d8 + 0x10),&local_698);
  _Var29._M_p = &stack0xfffffffffffff448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff438,"subword","");
  _Var31._M_p = &stack0xfffffffffffff488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff478,"Arguments for subword learner","");
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_8e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_b68.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_8e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_b68.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"");
  cxxopts::OptionAdder::operator()
            (pOVar10,(string *)&stack0xfffffffffffff438,(string *)&stack0xfffffffffffff478,
             &local_8e8,&local_6b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if (local_8e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  iVar9 = argc;
  if (local_b68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_b68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var31._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffff488) {
    operator_delete(_Var31._M_p,(ulong)(in_stack_fffffffffffff488 + 1));
  }
  if ((element_type *)_Var29._M_p != (element_type *)&stack0xfffffffffffff448) {
    operator_delete(_Var29._M_p,in_stack_fffffffffffff448 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8c8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a88._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a88._M_string_length);
  }
  if (_Var27._M_p != &stack0xfffffffffffff418) {
    operator_delete(_Var27._M_p,in_stack_fffffffffffff418 + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c8._M_string_length);
  }
  if ((element_type *)_Var30._M_p != (element_type *)&stack0xfffffffffffff468) {
    operator_delete(_Var30._M_p,in_stack_fffffffffffff468 + 1);
  }
  if (_Var26._M_p != &stack0xfffffffffffff3f8) {
    operator_delete(_Var26._M_p,in_stack_fffffffffffff3f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9e8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a68._M_string_length);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_988._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_988 + 0x10)) {
    operator_delete((void *)local_988._0_8_,stack0xfffffffffffff688 + 1);
  }
  if ((undefined1 *)local_4f8._0_8_ != local_4f8 + 0x10) {
    operator_delete((void *)local_4f8._0_8_,local_4f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b48._8_8_);
  }
  if (p_Stack_a40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a40);
  }
  if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b28._0_8_ !=
      (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18) {
    operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if (_Stack_450._M_p != local_448 + 8) {
    operator_delete(_Stack_450._M_p,local_448._8_8_ + 1);
  }
  if (local_a08 != &local_9f8) {
    operator_delete(local_a08,
                    CONCAT44(local_9f8._M_allocated_capacity._4_4_,
                             local_9f8._M_allocated_capacity._0_4_) + 1);
  }
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"subword","");
  cxxopts::Options::parse_positional((Options *)local_1a8,&local_6d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  _Stack_450._M_p = local_1a8 + 0xa8;
  local_428._M_allocated_capacity = (size_type)local_3f8;
  local_458 = (undefined1  [8])local_1a8._152_8_;
  local_448._0_8_ = (pointer)0x0;
  local_448._8_8_ = 0;
  aStack_438._0_8_ = 0;
  aStack_438._M_local_buf[8] = local_1a8[0x81];
  local_428._8_8_ = 1;
  local_418._M_allocated_capacity = 0;
  local_418._8_8_ = 0;
  local_408._M_allocated_capacity = 0x3f800000;
  local_3f8._8_8_ = local_3c0;
  local_408._8_8_ = 0;
  local_3f8._0_8_ = (__node_base_ptr)0x0;
  aStack_3e8._M_allocated_capacity = 1;
  aStack_3e8._8_8_ = (_Hash_node_base *)0x0;
  aStack_3d8._M_allocated_capacity = 0;
  aStack_3d8._8_8_ = 0x3f800000;
  sStack_3c8 = 0;
  local_3c0[0] = (element_type *)0x0;
  cxxopts::OptionParser::parse((ParseResult *)local_4f8,(OptionParser *)local_458,argc,local_7a0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_3f8 + 8));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_428);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_448);
  local_458 = (undefined1  [8])local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"help","");
  sVar11 = cxxopts::ParseResult::count((ParseResult *)local_4f8,(string *)local_458);
  if (local_458 != (undefined1  [8])local_448) {
    operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
  }
  if (sVar11 != 0) {
    local_5b8._M_dataplus._M_p = (pointer)0x0;
    local_5b8._M_string_length = 0;
    local_5b8.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)local_458,(Options *)local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_5b8);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_458,(long)_Stack_450._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    if (local_458 != (undefined1  [8])local_448) {
      operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_5b8);
    iVar8 = 0;
    goto LAB_0010cdc4;
  }
  build_tokenization_options(&local_250,(ParseResult *)local_4f8);
  local_458 = (undefined1  [8])0x0;
  _Stack_450._M_p = (pointer)0x0;
  OVar6.lang._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3f0;
  OVar6._0_8_ = _Var26._M_p;
  OVar6.lang._M_string_length = in_stack_fffffffffffff3f8;
  OVar6.lang.field_2._M_allocated_capacity = in_stack_fffffffffffff400;
  OVar6.lang.field_2._8_8_ = _Var27._M_p;
  OVar6._40_8_ = p_Var28;
  OVar6.joiner._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  OVar6.joiner._8_16_ = in_stack_fffffffffffff420;
  OVar6.joiner.field_2._8_4_ = iVar9;
  OVar6.joiner.field_2._12_4_ = in_stack_fffffffffffff434;
  OVar6._80_8_ = _Var29._M_p;
  OVar6.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff480._M_pi;
  OVar6.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff448;
  OVar6.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff450;
  OVar6.segment_alphabet_codes._M_h._M_buckets = (__buckets_ptr)_Var30._M_p;
  OVar6.segment_alphabet_codes._M_h._M_bucket_count = (size_type)in_stack_fffffffffffff410._M_pi;
  OVar6.segment_alphabet_codes._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)in_stack_fffffffffffff468;
  OVar6.segment_alphabet_codes._M_h._M_element_count = in_stack_fffffffffffff470;
  OVar6.segment_alphabet_codes._M_h._M_rehash_policy._0_8_ = _Var31._M_p;
  OVar6.segment_alphabet_codes._M_h._M_rehash_policy._M_next_resize = (size_t)this_00;
  OVar6.segment_alphabet_codes._M_h._M_single_bucket = (__node_base_ptr)in_stack_fffffffffffff488;
  onmt::Tokenizer::Tokenizer((Tokenizer *)&local_5b8,OVar6,(shared_ptr *)&local_250);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_450._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_450._M_p);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_250.segment_alphabet_codes._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_250.segment_alphabet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.joiner._M_dataplus._M_p != &local_250.joiner.field_2) {
    operator_delete(local_250.joiner._M_dataplus._M_p,
                    local_250.joiner.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250.lang._M_dataplus._M_p != &local_250.lang.field_2) {
    operator_delete(local_250.lang._M_dataplus._M_p,local_250.lang.field_2._M_allocated_capacity + 1
                   );
  }
  local_458 = (undefined1  [8])local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"subword","");
  pOVar13 = cxxopts::ParseResult::operator[]((ParseResult *)local_4f8,(string *)local_458);
  pvVar14 = cxxopts::OptionValue::
            as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pOVar13);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b68,pvVar14);
  if (local_458 != (undefined1  [8])local_448) {
    operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
  }
  pbVar22 = local_b68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = std::__cxx11::string::compare
                    ((char *)local_b68.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar8 == 0) {
    local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6f8,"subword_learn [OPTION...] -- bpe","");
    local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"");
    cxxopts::Options::Options((Options *)local_458,&local_6f8,&local_718);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_718._M_dataplus._M_p != &local_718.field_2) {
      operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
    }
    local_a28._M_pi = &local_a18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a28,"");
    uVar23 = (uint)local_a18._vptr__Sp_counted_base;
    local_b18._0_8_ = local_a20;
    p_Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_988 + 0x10);
    if (local_a28._M_pi == &local_a18) {
      uStack_970 = local_a18._M_use_count;
      uStack_96c = local_a18._M_weak_count;
      local_988._0_8_ = p_Var28;
    }
    else {
      local_988._0_8_ = local_a28._M_pi;
    }
    uStack_974 = local_a18._vptr__Sp_counted_base._4_4_;
    local_988._16_4_ = (uint)local_a18._vptr__Sp_counted_base;
    local_988._8_8_ = local_a20;
    local_a20 = (pointer)0x0;
    local_a18._vptr__Sp_counted_base._0_4_ = (uint)local_a18._vptr__Sp_counted_base & 0xffffff00;
    local_b28._8_8_ = local_b18 + 8;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_988._0_8_ == p_Var28) {
      local_b18._8_8_ = CONCAT44(local_a18._vptr__Sp_counted_base._4_4_,uVar23);
      local_b18._20_4_ = uStack_96c;
      local_b18._16_4_ = uStack_970;
    }
    else {
      local_b28._8_8_ = local_988._0_8_;
      local_b18._8_8_ = stack0xfffffffffffff688;
    }
    local_b28._0_8_ = (Options *)local_458;
    local_a28._M_pi = &local_a18;
    local_988._0_8_ = p_Var28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"h,help","");
    _Var26._M_p = &stack0xfffffffffffff3f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffff3e8,"Show this help","");
    cxxopts::value<bool>();
    local_7b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_868;
    local_7b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_860;
    local_868 = (element_type *)0x0;
    p_Stack_860 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"");
    pOVar10 = cxxopts::OptionAdder::operator()
                        ((OptionAdder *)local_b28,(string *)local_988,
                         (string *)&stack0xfffffffffffff3e8,&local_7b8,&local_818);
    _Var30._M_p = &stack0xfffffffffffff468;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffff458,"s,symbols","");
    _Var27._M_p = &stack0xfffffffffffff418;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffff408,
               "Create this many new symbols (each representing a character n-gram)","");
    cxxopts::value<int>();
    _Var29._M_p = &stack0xfffffffffffff448;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff438,"10000","");
    (**(code **)(*local_768 + 0x50))(&local_878,local_768,&stack0xfffffffffffff438);
    local_7c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_878;
    local_7c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_870;
    local_878 = (element_type *)0x0;
    p_Stack_870 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"");
    pOVar10 = cxxopts::OptionAdder::operator()
                        (pOVar10,(string *)&stack0xfffffffffffff458,
                         (string *)&stack0xfffffffffffff408,&local_7c8,&local_838);
    _Var31._M_p = &stack0xfffffffffffff488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffff478,"min-frequency","");
    local_b48._0_8_ = local_b48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b48,"Stop if no symbol pair has frequency >= FREQ","");
    cxxopts::value<int>();
    local_a48 = (element_type *)local_a38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a48,"2","");
    (**(code **)(*local_778 + 0x50))(&local_888,local_778,&local_a48);
    local_7d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_888;
    local_7d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_880;
    local_888 = (element_type *)0x0;
    p_Stack_880 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"");
    pOVar10 = cxxopts::OptionAdder::operator()
                        (pOVar10,(string *)&stack0xfffffffffffff478,(string *)local_b48,&local_7d8,
                         &local_858);
    local_9e8._0_8_ = local_9e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"dict-input","");
    local_a68._M_dataplus._M_p = (pointer)&local_a68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a68,
               "If set, input file is interpreted as a dictionary where each line contains a word-count pair"
               ,"");
    cxxopts::value<bool>();
    local_8c8._M_allocated_capacity = (size_type)&local_8b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_8d8 + 0x10),"false","");
    (**(code **)(*local_788 + 0x50))(&local_898,local_788,local_8d8 + 0x10);
    local_7e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_898;
    local_7e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_890;
    local_898 = (element_type *)0x0;
    p_Stack_890 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"");
    pOVar10 = cxxopts::OptionAdder::operator()
                        (pOVar10,(string *)local_9e8,&local_a68,&local_7e8,&local_738);
    local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"t,total-symbols","");
    local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_9c8,
               "Subtract number of characters from the symbols to be generated (so that \'--symbols\' becomes an estimate for the total number of symbols needed to encode text)"
               ,"");
    cxxopts::value<bool>();
    local_8e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_8d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"false","");
    (**(code **)(*local_798 + 0x50))
              (&local_8b8.super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
                super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,local_798,
               &local_8e8);
    local_7f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_8b8.super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
         super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_7f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Stack_8a0;
    local_8b8.super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
    super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_8a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"");
    cxxopts::OptionAdder::operator()(pOVar10,&local_a88,&local_9c8,&local_7f8,&local_758);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
    }
    if (local_7f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_7f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_8a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_8a0);
    }
    if ((pointer)local_8e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr != (pointer)local_8d8) {
      operator_delete(local_8e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(ulong)(local_8d8._0_8_ + 1));
    }
    if (local_790 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_790);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
      operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
      operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_738._M_dataplus._M_p != &local_738.field_2) {
      operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
    }
    if (local_7e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_7e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_890 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_890);
    }
    if ((element_type *)local_8c8._M_allocated_capacity != &local_8b8) {
      operator_delete((void *)local_8c8._M_allocated_capacity,(long)local_8b8._vptr_Value + 1);
    }
    if (local_780 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_780);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
      operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_9e8._0_8_ != (element_type *)(local_9e8 + 0x10)) {
      operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_858._M_dataplus._M_p != &local_858.field_2) {
      operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
    }
    if (local_7d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_7d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_880 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_880);
    }
    if (local_a48 != (element_type *)local_a38) {
      operator_delete(local_a48,local_a38._0_8_ + 1);
    }
    if (local_770 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_770);
    }
    if ((element_type *)local_b48._0_8_ != (element_type *)(local_b48 + 0x10)) {
      operator_delete((void *)local_b48._0_8_,local_b48._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var31._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffff488) {
      operator_delete(_Var31._M_p,(ulong)(in_stack_fffffffffffff488 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838._M_dataplus._M_p != &local_838.field_2) {
      operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
    }
    if (local_7c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_7c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_870 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_870);
    }
    if ((element_type *)_Var29._M_p != (element_type *)&stack0xfffffffffffff448) {
      operator_delete(_Var29._M_p,in_stack_fffffffffffff448 + 1);
    }
    if (local_760 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_760);
    }
    if (_Var27._M_p != &stack0xfffffffffffff418) {
      operator_delete(_Var27._M_p,in_stack_fffffffffffff418 + 1);
    }
    if ((element_type *)_Var30._M_p != (element_type *)&stack0xfffffffffffff468) {
      operator_delete(_Var30._M_p,in_stack_fffffffffffff468 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._M_dataplus._M_p != &local_818.field_2) {
      operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
    }
    if (local_7b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_7b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (p_Stack_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_860);
    }
    if (_Var26._M_p != &stack0xfffffffffffff3f8) {
      operator_delete(_Var26._M_p,in_stack_fffffffffffff3f8 + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_988._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_988 + 0x10)) {
      operator_delete((void *)local_988._0_8_,(ulong)(stack0xfffffffffffff688 + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b28._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b18 + 8)) {
      operator_delete((void *)local_b28._8_8_,(ulong)(local_b18._8_8_ + 1));
    }
    if (local_a28._M_pi != &local_a18) {
      operator_delete(local_a28._M_pi,
                      CONCAT44(local_a18._vptr__Sp_counted_base._4_4_,
                               (uint)local_a18._vptr__Sp_counted_base) + 1);
    }
    pbVar22 = local_b68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar24 = (long)local_b68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = uVar24 * 0x8000000;
    uVar20 = 0xffffffffffffffff;
    if (-1 < lVar17) {
      uVar20 = lVar17 >> 0x1d;
    }
    argv_00 = (char **)operator_new__(uVar20);
    uVar23 = (uint)(uVar24 >> 5);
    if (0 < (int)uVar23) {
      uVar20 = 0;
      do {
        argv_00[uVar20] = (pbVar22->_M_dataplus)._M_p;
        uVar20 = uVar20 + 1;
        pbVar22 = pbVar22 + 1;
      } while ((uVar23 & 0x7fffffff) != uVar20);
    }
    local_b28._8_8_ = local_3b0;
    local_af8._M_buckets = &local_af8._M_single_bucket;
    local_b28._0_8_ = local_3c0[0];
    local_b18._0_8_ = (pointer)0x0;
    local_b18._8_8_ = (pointer)0x0;
    local_b18._16_8_ = (pointer)0x0;
    local_b00 = (bool)aStack_3d8._M_local_buf[1];
    local_af8._M_bucket_count = 1;
    local_af8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_af8._M_element_count = 0;
    local_af8._M_rehash_policy._M_max_load_factor = 1.0;
    local_af8._M_rehash_policy._4_4_ = 0;
    local_ac0._M_buckets = &local_ac0._M_single_bucket;
    local_af8._M_rehash_policy._M_next_resize = 0;
    local_af8._M_single_bucket = (__node_base_ptr)0x0;
    local_ac0._M_bucket_count = 1;
    local_ac0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_ac0._M_element_count = 0;
    local_ac0._M_rehash_policy._M_max_load_factor = 1.0;
    local_ac0._M_rehash_policy._4_4_ = 0;
    local_ac0._M_rehash_policy._M_next_resize = 0;
    local_ac0._M_single_bucket = (__node_base_ptr)0x0;
    cxxopts::OptionParser::parse((ParseResult *)local_988,(OptionParser *)local_b28,uVar23,argv_00);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_ac0);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_af8);
    std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
              ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18);
    operator_delete__(argv_00);
    local_b28._0_8_ = (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"help","");
    sVar11 = cxxopts::ParseResult::count((ParseResult *)local_988,(string *)local_b28);
    if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b28._0_8_ !=
        (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18) {
      operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
    }
    if (sVar11 == 0) {
      pvVar18 = operator_new(0x68);
      iVar9 = (int)pvVar18;
      in_stack_fffffffffffff434 = (undefined4)((ulong)pvVar18 >> 0x20);
      local_b28._0_8_ = local_b18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"verbose","");
      pOVar13 = cxxopts::ParseResult::operator[]((ParseResult *)local_4f8,(string *)local_b28);
      pbVar15 = cxxopts::OptionValue::as<bool>(pOVar13);
      bVar25 = *pbVar15;
      _Var26._M_p = &stack0xfffffffffffff3f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff3e8,"symbols","");
      pOVar13 = cxxopts::ParseResult::operator[]
                          ((ParseResult *)local_988,(string *)&stack0xfffffffffffff3e8);
      piVar19 = cxxopts::OptionValue::as<int>(pOVar13);
      iVar8 = *piVar19;
      _Var30._M_p = &stack0xfffffffffffff468;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff458,"min-frequency","");
      pOVar13 = cxxopts::ParseResult::operator[]
                          ((ParseResult *)local_988,(string *)&stack0xfffffffffffff458);
      piVar19 = cxxopts::OptionValue::as<int>(pOVar13);
      iVar3 = *piVar19;
      _Var27._M_p = &stack0xfffffffffffff418;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff408,"dict-input","");
      pOVar13 = cxxopts::ParseResult::operator[]
                          ((ParseResult *)local_988,(string *)&stack0xfffffffffffff408);
      pbVar15 = cxxopts::OptionValue::as<bool>(pOVar13);
      bVar2 = *pbVar15;
      _Var29._M_p = &stack0xfffffffffffff448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff438,"total-symbols","");
      pOVar13 = cxxopts::ParseResult::operator[]
                          ((ParseResult *)local_988,(string *)&stack0xfffffffffffff438);
      pbVar15 = cxxopts::OptionValue::as<bool>(pOVar13);
      onmt::BPELearner::BPELearner
                ((BPELearner *)CONCAT44(in_stack_fffffffffffff434,iVar9),bVar25,iVar8,iVar3,bVar2,
                 *pbVar15);
      if ((element_type *)_Var29._M_p != (element_type *)&stack0xfffffffffffff448) {
        operator_delete(_Var29._M_p,in_stack_fffffffffffff448 + 1);
      }
      if (_Var27._M_p != &stack0xfffffffffffff418) {
        operator_delete(_Var27._M_p,in_stack_fffffffffffff418 + 1);
      }
      if ((element_type *)_Var30._M_p != (element_type *)&stack0xfffffffffffff468) {
        operator_delete(_Var30._M_p,in_stack_fffffffffffff468 + 1);
      }
      if (_Var26._M_p != &stack0xfffffffffffff3f8) {
        operator_delete(_Var26._M_p,in_stack_fffffffffffff3f8 + 1);
      }
      if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b28._0_8_ !=
          (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18) {
        operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
      }
    }
    else {
      cxxopts::Options::help
                ((string *)local_b28,(Options *)local_458,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffff3e8);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_b28._0_8_,local_b28._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b28._0_8_ !=
          (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18) {
        operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffff3e8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_900);
    std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_918);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_950);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_988);
    cxxopts::Options::~Options((Options *)local_458);
    iVar8 = 0;
    if (sVar11 == 0) {
      local_458 = (undefined1  [8])local_448;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"input","");
      sVar11 = cxxopts::ParseResult::count((ParseResult *)local_4f8,(string *)local_458);
      if (local_458 != (undefined1  [8])local_448) {
        operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
      }
      if (sVar11 == 0) {
        iVar8 = 0;
        (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffff434,iVar9) + 0x28))
                  ((long *)CONCAT44(in_stack_fffffffffffff434,iVar9),&std::cin,&local_5b8);
      }
      else {
        local_458 = (undefined1  [8])local_448;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"input","");
        pOVar13 = cxxopts::ParseResult::operator[]((ParseResult *)local_4f8,(string *)local_458);
        pvVar14 = cxxopts::OptionValue::
                  as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (pOVar13);
        if (local_458 != (undefined1  [8])local_448) {
          operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
        }
        pbVar22 = (pvVar14->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (pvVar14->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        bVar25 = pbVar22 == pbVar4;
        if (bVar25) {
          iVar8 = 0;
        }
        else {
          iVar8 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Parsing ",8);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(pbVar22->_M_dataplus)._M_p,
                                 pbVar22->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"...",3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            std::ifstream::ifstream(local_458);
            std::ifstream::open(local_458,(_Ios_Openmode)(pbVar22->_M_dataplus)._M_p);
            std::istream::seekg(local_458,0,0);
            iVar3 = *(int *)((long)&aStack_438 + *(long *)((long)local_458 + -0x18));
            if (iVar3 == 0) {
              (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffff434,iVar9) + 0x28))
                        ((long *)CONCAT44(in_stack_fffffffffffff434,iVar9),local_458,&local_5b8);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ERROR: cannot open file ",0x18);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(pbVar22->_M_dataplus)._M_p,
                                   pbVar22->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," for reading ",0xd);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
              std::ostream::put((char)poVar12);
              iVar8 = 1;
              std::ostream::flush();
            }
            std::ifstream::~ifstream(local_458);
            if (iVar3 != 0) break;
            pbVar22 = pbVar22 + 1;
            bVar25 = pbVar22 == pbVar4;
          } while (!bVar25);
        }
        if (!bVar25) goto LAB_0010cd33;
      }
      std::ofstream::ofstream(local_458);
      local_b28._0_8_ = local_b18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"output","");
      sVar11 = cxxopts::ParseResult::count((ParseResult *)local_4f8,(string *)local_b28);
      if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b28._0_8_ !=
          (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18) {
        operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
      }
      if (sVar11 == 0) {
        pcVar21 = (char *)&std::cout;
LAB_0010cce1:
        iVar8 = 0;
        (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffff434,iVar9) + 0x30))
                  ((long *)CONCAT44(in_stack_fffffffffffff434,iVar9),pcVar21,
                   "Generated with subword_learn cli",0);
      }
      else {
        local_988._0_8_ = local_988 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"output","");
        pOVar13 = cxxopts::ParseResult::operator[]((ParseResult *)local_4f8,(string *)local_988);
        pbVar16 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar13);
        local_b28._0_8_ = local_b18;
        pcVar5 = (pbVar16->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b28,pcVar5,pcVar5 + pbVar16->_M_string_length);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_988._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_988 + 0x10)) {
          operator_delete((void *)local_988._0_8_,(ulong)(stack0xfffffffffffff688 + 1));
        }
        pcVar21 = local_458;
        std::ofstream::open(pcVar21,(_Ios_Openmode)local_b28._0_8_);
        uVar23 = *(uint *)((long)&aStack_438 + *(long *)((long)local_458 + -0x18));
        if ((uVar23 & 5) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ERROR: cannot open file ",0x18);
          pcVar21 = (char *)&std::cout;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_b28._0_8_,local_b28._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," for writing ",0xd);
          iVar8 = 1;
          std::endl<char,std::char_traits<char>>(poVar12);
        }
        if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b28._0_8_ !=
            (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18) {
          operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
        }
        if ((uVar23 & 5) == 0) goto LAB_0010cce1;
      }
      local_458 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_458 + *(long *)&_VTT[-1].m_option_map._M_h._M_rehash_policy) = _memcpy;
      std::filebuf::~filebuf((filebuf *)&_Stack_450);
      std::ios_base::~ios_base(local_360);
    }
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)pbVar22);
    if (iVar9 == 0) {
      this = (SentencePieceLearner *)operator_new(0x78);
      local_458 = (undefined1  [8])local_448;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"verbose","");
      pOVar13 = cxxopts::ParseResult::operator[]((ParseResult *)local_4f8,(string *)local_458);
      pbVar15 = cxxopts::OptionValue::as<bool>(pOVar13);
      bVar25 = *pbVar15;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_988,
                 local_b68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_b68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (allocator_type *)&stack0xfffffffffffff3e8);
      local_b28._0_8_ = (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"tmpfile","");
      pOVar13 = cxxopts::ParseResult::operator[]((ParseResult *)local_4f8,(string *)local_b28);
      pbVar16 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar13);
      onmt::SentencePieceLearner::SentencePieceLearner
                (this,bVar25,(vector *)local_988,(string *)pbVar16,false,false);
      if ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b28._0_8_ !=
          (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_b18) {
        operator_delete((void *)local_b28._0_8_,(ulong)(local_b18._0_8_ + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_988);
      if (local_458 != (undefined1  [8])local_448) {
        operator_delete((void *)local_458,(ulong)(local_448._0_8_ + 1));
      }
      iVar8 = 1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR: invalid subword type: ",0x1d);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(pbVar22->_M_dataplus)._M_p,
                           pbVar22->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," (accepted: bpe, sentencepiece)",0x1f);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      iVar8 = 1;
      std::ostream::flush();
    }
  }
LAB_0010cd33:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b68);
  local_5b8._M_dataplus._M_p = (pointer)std::ofstream::ofstream;
  if (local_500 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_500);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_540);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_558);
  if (local_580 != local_570) {
    operator_delete(local_580,local_570[0] + 1);
  }
  if ((long *)local_5b8.field_2._M_allocated_capacity != local_598) {
    operator_delete((void *)local_5b8.field_2._M_allocated_capacity,local_598[0] + 1);
  }
LAB_0010cdc4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_470);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_488);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_4c0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_4f8);
  cxxopts::Options::~Options((Options *)local_1a8);
  return iVar8;
}

Assistant:

int main(int argc, char* argv[])
{
  cxxopts::Options cmd_options("subword_learn",
                               "Subword learning script.\n\nsubword_learn "
                               "[TOKENIZATION_OPTIONS...] -- [SUBWORD_TYPE] "
                               "[SUBWORD_OPTIONS...] < input_file > output_file\n");
  cmd_options.add_options()
    ("h,help", "Show this help")
    ("v,verbose", "Enable verbose output",
     cxxopts::value<bool>()->default_value("false"))
    ;

  add_tokenization_options(cmd_options);

  cmd_options.add_options("Subword learning")
    ("i,input", "Input files (if not set, the standard input is used)",
     cxxopts::value<std::vector<std::string>>())
    ("o,output", "Output file (if not set, the standard output is used)",
     cxxopts::value<std::string>())
    ("tmpfile", "Temporary file for file-based learner",
     cxxopts::value<std::string>()->default_value("input.tmp"))
    ("subword", "Arguments for subword learner",
     cxxopts::value<std::vector<std::string>>());

  cmd_options.parse_positional("subword");

  auto vm = cmd_options.parse(argc, argv);

  if (vm.count("help"))
  {
    std::cout << cmd_options.help() << std::endl;
    return 0;
  }

  onmt::Tokenizer tokenizer(build_tokenization_options(vm));
  onmt::SubwordLearner *learner;

  const auto subword_args = vm["subword"].as<std::vector<std::string>>();
  const auto& subword = subword_args[0];
  if (subword == "bpe")
  {
    cxxopts::Options bpe_options("subword_learn [OPTION...] -- bpe");
    bpe_options.add_options()
      ("h,help", "Show this help")
      ("s,symbols", "Create this many new symbols (each representing a character n-gram)",
       cxxopts::value<int>()->default_value("10000"))
      ("min-frequency", "Stop if no symbol pair has frequency >= FREQ",
       cxxopts::value<int>()->default_value("2"))
      ("dict-input",
       "If set, input file is interpreted as a dictionary where each line "
       "contains a word-count pair",
       cxxopts::value<bool>()->default_value("false"))
      ("t,total-symbols",
       "Subtract number of characters from the symbols to be generated "
       "(so that '--symbols' becomes an estimate for the total number of "
       "symbols needed to encode text)",
       cxxopts::value<bool>()->default_value("false"))
      ;

    // Parse BPE options only.
    int subargc = subword_args.size();
    char** subargv = new char*[subargc];
    for (int i = 0; i < subargc; ++i)
      subargv[i] = const_cast<char*>(subword_args[i].c_str());
    auto subvm = bpe_options.parse(subargc, subargv);
    delete [] subargv;

    if (subvm.count("help"))
    {
      std::cout << bpe_options.help() << std::endl;
      return 0;
    }

    learner = new onmt::BPELearner(vm["verbose"].as<bool>(),
                                   subvm["symbols"].as<int>(),
                                   subvm["min-frequency"].as<int>(),
                                   subvm["dict-input"].as<bool>(),
                                   subvm["total-symbols"].as<bool>());

  }
  else if (subword == "sentencepiece") {
    learner = new onmt::SentencePieceLearner(vm["verbose"].as<bool>(),
                                             std::vector<std::string>(subword_args.begin() + 1,
                                                                      subword_args.end()),
                                             vm["tmpfile"].as<std::string>());
    return 1;
  }
  else {
    std::cerr << "ERROR: invalid subword type: " << subword << " (accepted: bpe, sentencepiece)" << std::endl;
    return 1;
  }

  if (vm.count("input")) {
    for(const std::string &inputFileName: vm["input"].as<std::vector<std::string> >()) {
      std::cerr << "Parsing " << inputFileName << "..." << std::endl;
      std::ifstream inputFile;
      inputFile.open(inputFileName.c_str());
      inputFile.seekg(0);
      if (inputFile.fail() || !inputFile.good()) {
        std::cout << "ERROR: cannot open file " << inputFileName << " for reading " << std::endl;
        return 1;
      }
      learner->ingest(inputFile, &tokenizer);
    }
  } else
    learner->ingest(std::cin, &tokenizer);

  std::ostream* pCout = &std::cout;
  std::ofstream outputFile;
  if (vm.count("output")) {
    std::string outputFileName = vm["output"].as<std::string>();
    outputFile.open(outputFileName.c_str());
    if (outputFile.fail()) {
      std::cout << "ERROR: cannot open file " << outputFileName << " for writing " << std::endl;
      return 1;
    }
    pCout = &outputFile;
  }
  learner->learn(*pCout, "Generated with subword_learn cli");

  return 0;
}